

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::RcExternMethodsInterfaceTest_UpdateRateControllerTest_Test>
::CreateTest(ParameterizedTestFactory<(anonymous_namespace)::RcExternMethodsInterfaceTest_UpdateRateControllerTest_Test>
             *this)

{
  RcExternMethodsInterfaceTest *this_00;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,int>>::parameter_ =
       &this->parameter_;
  this_00 = (RcExternMethodsInterfaceTest *)operator_new(0x630);
  anon_unknown.dwarf_32eca::RcExternMethodsInterfaceTest::RcExternMethodsInterfaceTest(this_00);
  (this_00->super_EncoderTest)._vptr_EncoderTest =
       (_func_int **)&PTR__RcExternMethodsInterfaceTest_005d4c80;
  (this_00->super_CodecTestWithParam<int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_int>_>.super_Test._vptr_Test =
       (_func_int **)&PTR__RcExternMethodsInterfaceTest_UpdateRateControllerTest_Test_005d4d30;
  (this_00->super_CodecTestWithParam<int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_int>_>.
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_int>_>.
  _vptr_WithParamInterface =
       (_func_int **)&PTR__RcExternMethodsInterfaceTest_UpdateRateControllerTest_Test_005d4d70;
  return (Test *)&this_00->super_CodecTestWithParam<int>;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }